

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_1.cpp
# Opt level: O0

void __thiscall
ImporterStrict_sineCellml11ImportInStrictMode_Test::TestBody
          (ImporterStrict_sineCellml11ImportInStrictMode_Test *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  AssertionResult local_3c8 [2];
  AssertHelper local_3a8 [8];
  Message local_3a0 [15];
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__1;
  ScopedTrace local_369;
  AssertHelper local_368 [7];
  ScopedTrace gtest_trace_79;
  Message local_360 [8];
  unsigned_long local_358 [2];
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  string local_330 [32];
  string local_310 [32];
  AssertionResult local_2f0 [2];
  AssertHelper local_2d0 [8];
  Message local_2c8 [15];
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_;
  ScopedTrace local_291;
  AssertHelper local_290 [7];
  ScopedTrace gtest_trace_74;
  Message local_288 [8];
  unsigned_long local_280 [2];
  undefined1 local_270 [8];
  AssertionResult gtest_ar;
  string local_258 [32];
  string local_238 [32];
  undefined1 local_218 [8];
  ModelPtr model;
  ImporterPtr importer;
  ParserPtr parser;
  string local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator<char> local_179;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_101;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedImporterIssues;
  ImporterStrict_sineCellml11ImportInStrictMode_Test *this_local;
  
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
       1;
  local_a0 = &local_98;
  expectedImporterIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"cellml1X/sin.xml",&local_101);
  resourcePath((string *)&local_e0);
  std::operator+(&local_c0,"Import of component \'actual_sin\' from \'",&local_e0);
  std::operator+(&local_98,&local_c0,"\' requires component named \'sin\' which cannot be found.");
  local_a0 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"cellml1X/deriv_approx_sin.xml",&local_179);
  resourcePath((string *)&local_158);
  std::operator+(&local_138,"Import of component \'deriv_approx_sin\' from \'",&local_158);
  std::operator+(&local_78,&local_138,"\' requires component named \'sin\' which cannot be found.");
  local_a0 = &local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"cellml1X/parabolic_approx_sin.xml",
             (allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  resourcePath((string *)&local_1c0);
  std::operator+(&local_1a0,"Import of component \'parabolic_approx_sin\' from \'",&local_1c0);
  std::operator+(&local_58,&local_1a0,"\' requires component named \'sin\' which cannot be found.");
  parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
       0;
  local_38 = &local_98;
  local_30 = 3;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 5));
  local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_400 = local_400 + -1;
    std::__cxx11::string::~string((string *)local_400);
  } while (local_400 != &local_98);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  this_01 = &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_01,0));
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"cellml1X/sin_approximations_import.xml",
             (allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  fileContents(local_238);
  libcellml::Parser::parseModel((string *)local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_280[1] = 3;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_280[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_270,"size_t(3)","parser->issueCount()",local_280 + 1,local_280
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(local_290,local_288);
    testing::internal::AssertHelper::~AssertHelper(local_290);
    testing::Message::~Message(local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  testing::ScopedTrace::ScopedTrace
            (&local_291,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
             ,0x4a,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Parser,void>
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_.message_,
             (shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  expectEqualIssues((vector *)&expectedParserIssues_abi_cxx11_,(shared_ptr *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Logger>::~shared_ptr
            ((shared_ptr<libcellml::Logger> *)&gtest_ar_.message_);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_218);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_2b9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_2f0,local_2b8,"model->hasUnresolvedImports()","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(local_2d0,local_2c8);
    testing::internal::AssertHelper::~AssertHelper(local_2d0);
    std::__cxx11::string::~string((string *)local_2f0);
    testing::Message::~Message(local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  peVar4 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"cellml1X",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  resourcePath(local_310);
  libcellml::Importer::resolveImports((shared_ptr *)peVar4,(string *)local_218);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_358[1] = 3;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_358[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_348,"size_t(3)","importer->issueCount()",local_358 + 1,
             local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(local_360);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              (local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(local_368,local_360);
    testing::internal::AssertHelper::~AssertHelper(local_368);
    testing::Message::~Message(local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  testing::ScopedTrace::ScopedTrace
            (&local_369,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
             ,0x4f,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Importer,void>
            ((shared_ptr<libcellml::Logger> *)&gtest_ar__1.message_,
             (shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  expectEqualIssues((vector *)local_28,(shared_ptr *)&gtest_ar__1.message_);
  std::shared_ptr<libcellml::Logger>::~shared_ptr
            ((shared_ptr<libcellml::Logger> *)&gtest_ar__1.message_);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_218);
  bVar2 = libcellml::Model::hasUnresolvedImports();
  local_391 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_3c8,local_390,"model->hasUnresolvedImports()","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/cellml_1_1.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=(local_3a8,local_3a0);
    testing::internal::AssertHelper::~AssertHelper(local_3a8);
    std::__cxx11::string::~string((string *)local_3c8);
    testing::Message::~Message(local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  testing::ScopedTrace::~ScopedTrace(&local_369);
  testing::ScopedTrace::~ScopedTrace(&local_291);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_218);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(ImporterStrict, sineCellml11ImportInStrictMode)
{
    const std::vector<std::string> expectedImporterIssues = {
        "Import of component 'actual_sin' from '" + resourcePath("cellml1X/sin.xml") + "' requires component named 'sin' which cannot be found.",
        "Import of component 'deriv_approx_sin' from '" + resourcePath("cellml1X/deriv_approx_sin.xml") + "' requires component named 'sin' which cannot be found.",
        "Import of component 'parabolic_approx_sin' from '" + resourcePath("cellml1X/parabolic_approx_sin.xml") + "' requires component named 'sin' which cannot be found.",
    };

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("cellml1X/sin_approximations_import.xml"));

    EXPECT_EQ(size_t(3), parser->issueCount());
    EXPECT_EQ_ISSUES(expectedParserIssues, parser);
    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("cellml1X"));
    EXPECT_EQ(size_t(3), importer->issueCount());
    EXPECT_EQ_ISSUES(expectedImporterIssues, importer);
    EXPECT_TRUE(model->hasUnresolvedImports());
}